

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_setup(nk_draw_list *canvas,nk_convert_config *config,nk_buffer *cmds,
                       nk_buffer *vertices,nk_buffer *elements,nk_anti_aliasing line_aa,
                       nk_anti_aliasing shape_aa)

{
  nk_handle nVar1;
  nk_vec2 nVar2;
  nk_draw_vertex_layout_element *pnVar3;
  nk_size nVar4;
  nk_size nVar5;
  nk_anti_aliasing nVar6;
  nk_anti_aliasing nVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (canvas == (nk_draw_list *)0x0) {
    __assert_fail("canvas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x23bf,
                  "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
                 );
  }
  if (config == (nk_convert_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x23c0,
                  "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
                 );
  }
  if (cmds == (nk_buffer *)0x0) {
    __assert_fail("cmds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x23c1,
                  "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
                 );
  }
  if (vertices != (nk_buffer *)0x0) {
    if (elements != (nk_buffer *)0x0) {
      canvas->buffer = cmds;
      nVar6 = config->line_AA;
      nVar7 = config->shape_AA;
      uVar8 = config->circle_segment_count;
      uVar9 = config->arc_segment_count;
      uVar10 = config->curve_segment_count;
      nVar1 = (config->null).texture;
      nVar2 = (config->null).uv;
      pnVar3 = config->vertex_layout;
      nVar4 = config->vertex_size;
      nVar5 = config->vertex_alignment;
      (canvas->config).global_alpha = config->global_alpha;
      (canvas->config).line_AA = nVar6;
      (canvas->config).shape_AA = nVar7;
      (canvas->config).circle_segment_count = uVar8;
      (canvas->config).arc_segment_count = uVar9;
      (canvas->config).curve_segment_count = uVar10;
      (canvas->config).null.texture = nVar1;
      (canvas->config).null.uv = nVar2;
      (canvas->config).vertex_layout = pnVar3;
      (canvas->config).vertex_size = nVar4;
      (canvas->config).vertex_alignment = nVar5;
      canvas->elements = elements;
      canvas->vertices = vertices;
      canvas->line_AA = line_aa;
      canvas->shape_AA = shape_aa;
      canvas->clip_rect = nk_null_rect;
      canvas->element_count = 0;
      canvas->vertex_count = 0;
      canvas->cmd_offset = 0;
      canvas->cmd_count = 0;
      canvas->path_count = 0;
      return;
    }
    __assert_fail("elements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x23c3,
                  "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
                 );
  }
  __assert_fail("vertices",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x23c2,
                "void nk_draw_list_setup(struct nk_draw_list *, const struct nk_convert_config *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, enum nk_anti_aliasing, enum nk_anti_aliasing)"
               );
}

Assistant:

NK_API void
nk_draw_list_setup(struct nk_draw_list *canvas, const struct nk_convert_config *config,
    struct nk_buffer *cmds, struct nk_buffer *vertices, struct nk_buffer *elements,
    enum nk_anti_aliasing line_aa, enum nk_anti_aliasing shape_aa)
{
    NK_ASSERT(canvas);
    NK_ASSERT(config);
    NK_ASSERT(cmds);
    NK_ASSERT(vertices);
    NK_ASSERT(elements);
    if (!canvas || !config || !cmds || !vertices || !elements)
        return;

    canvas->buffer = cmds;
    canvas->config = *config;
    canvas->elements = elements;
    canvas->vertices = vertices;
    canvas->line_AA = line_aa;
    canvas->shape_AA = shape_aa;
    canvas->clip_rect = nk_null_rect;

    canvas->cmd_offset = 0;
    canvas->element_count = 0;
    canvas->vertex_count = 0;
    canvas->cmd_offset = 0;
    canvas->cmd_count = 0;
    canvas->path_count = 0;
}